

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,FunctionResultCallNode *node)

{
  ExpressionNode *pEVar1;
  int iVar2;
  optional<TypeName> *poVar3;
  undefined4 extraout_var;
  TypeName *__k;
  mapped_type *__rhs;
  long *plVar4;
  TypeChecker typeChecker;
  TypeChecker local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pEVar1 = (node->call_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,this);
  local_70.symbols_ = &this->symbols_;
  local_70.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001d0488;
  local_70.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName>._M_engaged = false;
  pEVar1 = (node->call_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_70);
  poVar3 = TypeChecker::getType(&local_70);
  if ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
      super__Optional_payload_base<TypeName>._M_engaged == true) {
    poVar3 = TypeChecker::getType(&local_70);
    if (((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
         super__Optional_payload_base<TypeName>._M_engaged != true) ||
       ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
        super__Optional_payload_base<TypeName>._M_payload._M_value != Function)) {
      poVar3 = TypeChecker::getType(&local_70);
      __k = std::optional<TypeName>::value(poVar3);
      __rhs = std::__detail::
              _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&TypeNameStrings_abi_cxx11_,__k);
      std::operator+(&local_38,"Cannot call result of function returning ",__rhs);
      std::operator+(&local_58,&local_38,"!");
      reportError(&local_58,(Node *)node);
    }
  }
  iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  while (plVar4 = (long *)*plVar4, plVar4 != (long *)CONCAT44(extraout_var,iVar2)) {
    (**(code **)(*(long *)plVar4[2] + 0x10))((long *)plVar4[2],this);
  }
  return;
}

Assistant:

void SemanticAnalyser::visit(const FunctionResultCallNode& node) 
{
  node.getCall().accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getCall().accept(typeChecker);
  if(typeChecker.getType().has_value() && typeChecker.getType() != TypeName::Function)
    reportError("Cannot call result of function returning " + 
      TypeNameStrings.at(typeChecker.getType().value()) + "!", node);
  
  for(const auto& arg : node.getArguments())
    arg->accept(*this);
}